

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

void Dsd_TreePrint_rec(FILE *pFile,Dsd_Node_t *pNode,int fComp,char **pInputNames,char *pOutputName,
                      int nOffset,int *pSigCounter,int fShortNames)

{
  int iVar1;
  uint uVar2;
  Dsd_Node_t *pDVar3;
  void *__ptr;
  long lVar4;
  char *pcVar5;
  Dsd_Node_t *pDVar6;
  char Buffer [100];
  
  if (4 < pNode->Type - DSD_NODE_CONST1) {
    __assert_fail("pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_CONST1 || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x2ab,
                  "void Dsd_TreePrint_rec(FILE *, Dsd_Node_t *, int, char **, char *, int, int *, int)"
                 );
  }
  Extra_PrintSymbols(pFile,' ',nOffset,0);
  pcVar5 = "NOT(%s) = ";
  if (fComp == 0) {
    pcVar5 = "%s = ";
  }
  fprintf((FILE *)pFile,pcVar5,pOutputName);
  __ptr = malloc((long)pNode->nDecs << 2);
  switch(pNode->Type) {
  case DSD_NODE_CONST1:
    fwrite(" Constant 1.\n",0xd,1,(FILE *)pFile);
    break;
  case DSD_NODE_BUF:
    uVar2 = pNode->S->index;
    if (fShortNames == 0) {
      fputs(pInputNames[uVar2],(FILE *)pFile);
    }
    else {
      fprintf((FILE *)pFile,"%d",(ulong)(uVar2 + 0x61));
    }
    fputc(10,(FILE *)pFile);
    break;
  case DSD_NODE_OR:
    fwrite("OR(",3,1,(FILE *)pFile);
    for (lVar4 = 0; lVar4 < pNode->nDecs; lVar4 = lVar4 + 1) {
      pDVar3 = pNode->pDecs[lVar4];
      if (lVar4 != 0) {
        fputc(0x2c,(FILE *)pFile);
      }
      pDVar6 = (Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
      if (pDVar3 == pDVar6) {
        fputc(0x20,(FILE *)pFile);
      }
      else {
        fwrite(" NOT(",5,1,(FILE *)pFile);
      }
      if (pDVar6->Type == DSD_NODE_BUF) {
        *(undefined4 *)((long)__ptr + lVar4 * 4) = 0;
        uVar2 = pDVar6->S->index;
        if (fShortNames == 0) {
          fputs(pInputNames[uVar2],(FILE *)pFile);
        }
        else {
          fputc(uVar2 + 0x61,(FILE *)pFile);
        }
      }
      else {
        iVar1 = *pSigCounter;
        *pSigCounter = iVar1 + 1;
        *(int *)((long)__ptr + lVar4 * 4) = iVar1;
        fprintf((FILE *)pFile,"<%d>");
      }
      if (pDVar3 != pDVar6) {
        fputc(0x29,(FILE *)pFile);
      }
    }
    fwrite(" )\n",3,1,(FILE *)pFile);
    for (lVar4 = 0; lVar4 < pNode->nDecs; lVar4 = lVar4 + 1) {
      if (*(int *)((long)__ptr + lVar4 * 4) != 0) {
        sprintf(Buffer,"<%d>");
        Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar4] & 0xfffffffffffffffe),0,
                          pInputNames,Buffer,nOffset + 6,pSigCounter,fShortNames);
      }
    }
    break;
  case DSD_NODE_EXOR:
    fwrite("EXOR(",5,1,(FILE *)pFile);
    for (lVar4 = 0; lVar4 < pNode->nDecs; lVar4 = lVar4 + 1) {
      pDVar3 = pNode->pDecs[lVar4];
      if (lVar4 != 0) {
        fputc(0x2c,(FILE *)pFile);
      }
      pDVar6 = (Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
      if (pDVar3 == pDVar6) {
        fputc(0x20,(FILE *)pFile);
      }
      else {
        fwrite(" NOT(",5,1,(FILE *)pFile);
      }
      if (pDVar6->Type == DSD_NODE_BUF) {
        *(undefined4 *)((long)__ptr + lVar4 * 4) = 0;
        uVar2 = pDVar6->S->index;
        if (fShortNames == 0) {
          fputs(pInputNames[uVar2],(FILE *)pFile);
        }
        else {
          fputc(uVar2 + 0x61,(FILE *)pFile);
        }
      }
      else {
        iVar1 = *pSigCounter;
        *pSigCounter = iVar1 + 1;
        *(int *)((long)__ptr + lVar4 * 4) = iVar1;
        fprintf((FILE *)pFile,"<%d>");
      }
      if (pDVar3 != pDVar6) {
        fputc(0x29,(FILE *)pFile);
      }
    }
    fwrite(" )\n",3,1,(FILE *)pFile);
    for (lVar4 = 0; lVar4 < pNode->nDecs; lVar4 = lVar4 + 1) {
      if (*(int *)((long)__ptr + lVar4 * 4) != 0) {
        sprintf(Buffer,"<%d>");
        Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar4] & 0xfffffffffffffffe),0,
                          pInputNames,Buffer,nOffset + 6,pSigCounter,fShortNames);
      }
    }
    break;
  case DSD_NODE_PRIME:
    fwrite("PRIME(",6,1,(FILE *)pFile);
    for (lVar4 = 0; lVar4 < pNode->nDecs; lVar4 = lVar4 + 1) {
      pDVar3 = pNode->pDecs[lVar4];
      if (lVar4 != 0) {
        fputc(0x2c,(FILE *)pFile);
      }
      pDVar6 = (Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
      if (pDVar3 == pDVar6) {
        fputc(0x20,(FILE *)pFile);
      }
      else {
        fwrite(" NOT(",5,1,(FILE *)pFile);
      }
      if (pDVar6->Type == DSD_NODE_BUF) {
        *(undefined4 *)((long)__ptr + lVar4 * 4) = 0;
        if (fShortNames != 0) {
          pcVar5 = "%d";
          goto LAB_006793a3;
        }
        fputs(pInputNames[pDVar6->S->index],(FILE *)pFile);
      }
      else {
        iVar1 = *pSigCounter;
        *pSigCounter = iVar1 + 1;
        *(int *)((long)__ptr + lVar4 * 4) = iVar1;
        pcVar5 = "<%d>";
LAB_006793a3:
        fprintf((FILE *)pFile,pcVar5);
      }
      if (pDVar3 != pDVar6) {
        fputc(0x29,(FILE *)pFile);
      }
    }
    fwrite(" )\n",3,1,(FILE *)pFile);
    for (lVar4 = 0; lVar4 < pNode->nDecs; lVar4 = lVar4 + 1) {
      if (*(int *)((long)__ptr + lVar4 * 4) != 0) {
        sprintf(Buffer,"<%d>");
        Dsd_TreePrint_rec(pFile,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar4] & 0xfffffffffffffffe),0,
                          pInputNames,Buffer,nOffset + 6,pSigCounter,fShortNames);
      }
    }
  }
  free(__ptr);
  return;
}

Assistant:

void Dsd_TreePrint_rec( FILE * pFile, Dsd_Node_t * pNode, int fComp, char * pInputNames[], char * pOutputName, int nOffset, int * pSigCounter, int fShortNames )
{
    char Buffer[100];
    Dsd_Node_t * pInput;
    int * pInputNums;
    int fCompNew, i;

    assert( pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_CONST1 || 
        pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR ); 

    Extra_PrintSymbols( pFile, ' ', nOffset, 0 );
    if ( !fComp )
        fprintf( pFile, "%s = ", pOutputName );
    else
        fprintf( pFile, "NOT(%s) = ", pOutputName );
    pInputNums = ABC_ALLOC( int, pNode->nDecs );
    if ( pNode->Type == DSD_NODE_CONST1 )
    {
        fprintf( pFile, " Constant 1.\n" );
    }
    else if ( pNode->Type == DSD_NODE_BUF )
    {
        if ( fShortNames )
            fprintf( pFile, "%d", 'a' + pNode->S->index );
        else
            fprintf( pFile, "%s", pInputNames[pNode->S->index] );
        fprintf( pFile, "\n" );
    }
    else if ( pNode->Type == DSD_NODE_PRIME )
    {
        // print the line
        fprintf( pFile, "PRIME(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput   = Dsd_Regular( pNode->pDecs[i] );
            fCompNew = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%d", pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput   = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    else if ( pNode->Type == DSD_NODE_OR )
    {
        // print the line
        fprintf( pFile, "OR(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput = Dsd_Regular( pNode->pDecs[i] );
            fCompNew  = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%c", 'a' + pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    else if ( pNode->Type == DSD_NODE_EXOR )
    {
        // print the line
        fprintf( pFile, "EXOR(" );
        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pInput = Dsd_Regular( pNode->pDecs[i] );
            fCompNew  = (int)( pInput != pNode->pDecs[i] );
            if ( i )
                fprintf( pFile, "," );
            if ( fCompNew )
                fprintf( pFile, " NOT(" );
            else
                fprintf( pFile, " " );
            if ( pInput->Type == DSD_NODE_BUF )
            {
                pInputNums[i] = 0;
                if ( fShortNames )
                    fprintf( pFile, "%c", 'a' + pInput->S->index );
                else
                    fprintf( pFile, "%s", pInputNames[pInput->S->index] );
            }
            else
            {
                pInputNums[i] = (*pSigCounter)++;
                fprintf( pFile, "<%d>", pInputNums[i] );
            }
            if ( fCompNew )
                fprintf( pFile, ")" );
        }
        fprintf( pFile, " )\n" );
        // call recursively for the following blocks
        for ( i = 0; i < pNode->nDecs; i++ )
            if ( pInputNums[i] )
            {
                pInput = Dsd_Regular( pNode->pDecs[i] );
                sprintf( Buffer, "<%d>", pInputNums[i] );
                Dsd_TreePrint_rec( pFile, Dsd_Regular( pNode->pDecs[i] ), 0, pInputNames, Buffer, nOffset + 6, pSigCounter, fShortNames );
            }
    }
    ABC_FREE( pInputNums );
}